

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# include.hpp
# Opt level: O0

p_rank * __thiscall p_rank::operator+(p_rank *__return_storage_ptr__,p_rank *this,p_rank *a)

{
  p_rank *a_local;
  p_rank *this_local;
  
  __return_storage_ptr__->A = a->A + this->A;
  __return_storage_ptr__->C = a->C + this->C;
  __return_storage_ptr__->G = a->G + this->G;
  __return_storage_ptr__->T = a->T + this->T;
  return __return_storage_ptr__;
}

Assistant:

p_rank operator+(const p_rank& a) const{

		return {
			a.A + A,
			a.C + C,
			a.G + G,
			a.T + T
		};

	}